

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
          (EventsProcessorTests *this,PileId *id,uint cardIndex,MouseLeftButtonDown *event)

{
  MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *this_01;
  MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this_02;
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this_03;
  ReturnAction<unsigned_int> local_110;
  Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> local_100;
  WithoutMatchers local_d9;
  Matcher<const_solitaire::geometry::Position_&> local_d8;
  MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> local_c0;
  StrictMock<solitaire::colliders::TableauPileColliderMock> *local_a0;
  Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)> local_98
  ;
  WithoutMatchers local_75 [17];
  PileId local_64;
  Matcher<solitaire::piles::PileId> local_60;
  MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  local_48;
  Position *local_28;
  MouseLeftButtonDown *event_local;
  PileId *pPStack_18;
  uint cardIndex_local;
  PileId *id_local;
  EventsProcessorTests *this_local;
  
  local_28 = &event->position;
  event_local._4_4_ = cardIndex;
  pPStack_18 = id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_64,id);
  testing::Matcher<solitaire::piles::PileId>::Matcher(&local_60,&local_64);
  ContextMock::gmock_getTableauPileCollider
            (&local_48,&(this->contextMock).super_ContextMock,&local_60);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
            ::operator()(&local_48,local_75,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x74,"contextMock","getTableauPileCollider(id)");
  local_a0 = (StrictMock<solitaire::colliders::TableauPileColliderMock> *)
             testing::ReturnRef<testing::StrictMock<solitaire::colliders::TableauPileColliderMock>>
                       (&this->tableauPileColliderMock);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_98,(ReturnRefAction *)&local_a0);
  testing::internal::
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  ::WillOnce(this_01,&local_98);
  testing::Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  ::~Action(&local_98);
  testing::internal::
  MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>::
  ~MockSpec(&local_48);
  testing::Matcher<solitaire::piles::PileId>::~Matcher(&local_60);
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher(&local_d8,local_28);
  colliders::TableauPileColliderMock::gmock_tryGetCollidedCardIndex
            (&local_c0,&(this->tableauPileColliderMock).super_TableauPileColliderMock,&local_d8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
            operator()(&local_c0,&local_d9,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x76,"tableauPileColliderMock",
                               "tryGetCollidedCardIndex(event.position)");
  testing::Return<unsigned_int>((testing *)&local_110,event_local._4_4_);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_100,(ReturnAction *)&local_110);
  testing::internal::
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_03,&local_100);
  testing::Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::~Action
            (&local_100);
  testing::internal::ReturnAction<unsigned_int>::~ReturnAction(&local_110);
  testing::internal::MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
  ~MockSpec(&local_c0);
  testing::Matcher<const_solitaire::geometry::Position_&>::~Matcher(&local_d8);
  return;
}

Assistant:

void acceptLeftButtonDownOnTableauPileCard(
        const PileId id, const unsigned cardIndex, const MouseLeftButtonDown& event)
    {
        EXPECT_CALL(contextMock, getTableauPileCollider(id))
            .WillOnce(ReturnRef(tableauPileColliderMock));
        EXPECT_CALL(tableauPileColliderMock, tryGetCollidedCardIndex(event.position))
            .WillOnce(Return(cardIndex));
    }